

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O0

CURLcode Curl_sha256it(uchar *output,uchar *input,size_t length)

{
  uint length_00;
  undefined1 local_30 [8];
  my_sha256_ctx ctx;
  CURLcode result;
  size_t length_local;
  uchar *input_local;
  uchar *output_local;
  
  ctx.openssl_ctx._4_4_ = my_sha256_init(local_30);
  if (ctx.openssl_ctx._4_4_ == CURLE_OK) {
    length_00 = curlx_uztoui(length);
    my_sha256_update(local_30,input,length_00);
    my_sha256_final(output,local_30);
  }
  return ctx.openssl_ctx._4_4_;
}

Assistant:

CURLcode Curl_sha256it(unsigned char *output, const unsigned char *input,
                       const size_t length)
{
  CURLcode result;
  my_sha256_ctx ctx;

  result = my_sha256_init(&ctx);
  if(!result) {
    my_sha256_update(&ctx, input, curlx_uztoui(length));
    my_sha256_final(output, &ctx);
  }
  return result;
}